

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_ctl.c
# Opt level: O0

void env_tilde_dsp(t_sigenv *x,t_signal **sp)

{
  t_sample *ptVar1;
  void *xx;
  t_signal **sp_local;
  t_sigenv *x_local;
  
  if (x->x_period % (*sp)->s_n == 0) {
    x->x_realperiod = x->x_period;
  }
  else {
    x->x_realperiod = (x->x_period + (*sp)->s_n) - x->x_period % (*sp)->s_n;
  }
  if (x->x_allocforvs < (*sp)->s_n) {
    ptVar1 = (t_sample *)
             resizebytes(x->x_buf,(long)(x->x_npoints + x->x_allocforvs) << 2,
                         (long)(x->x_npoints + (*sp)->s_n) << 2);
    if (ptVar1 == (t_sample *)0x0) {
      pd_error((void *)0x0,"env~: out of memory");
      return;
    }
    x->x_buf = ptVar1;
    x->x_allocforvs = (*sp)->s_n;
  }
  dsp_add(env_tilde_perform,3,x,(*sp)->s_vec,(long)(*sp)->s_n);
  return;
}

Assistant:

static void env_tilde_dsp(t_sigenv *x, t_signal **sp)
{
    if (x->x_period % sp[0]->s_n) x->x_realperiod =
        x->x_period + sp[0]->s_n - (x->x_period % sp[0]->s_n);
    else x->x_realperiod = x->x_period;
    if (sp[0]->s_n > x->x_allocforvs)
    {
        void *xx = resizebytes(x->x_buf,
            (x->x_npoints + x->x_allocforvs) * sizeof(t_sample),
            (x->x_npoints + sp[0]->s_n) * sizeof(t_sample));
        if (!xx)
        {
            pd_error(0, "env~: out of memory");
            return;
        }
        x->x_buf = (t_sample *)xx;
        x->x_allocforvs = sp[0]->s_n;
    }
    dsp_add(env_tilde_perform, 3, x, sp[0]->s_vec, (t_int)sp[0]->s_n);
}